

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateCommandVoid1Return
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,size_t returnParam,
          bool raii)

{
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *params;
  pointer __n;
  pointer pPVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_03;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_04;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_05;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_00;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_01;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_02;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_03;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_04;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_05;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_06;
  pointer pFVar2;
  bool bVar3;
  int iVar4;
  undefined7 in_register_00000089;
  initializer_list<unsigned_long> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_03;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_06;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_09;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_12;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_13;
  initializer_list<unsigned_long> __l_14;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_15;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_16;
  initializer_list<unsigned_long> __l_17;
  undefined8 uVar5;
  undefined6 in_stack_fffffffffffffd48;
  Flags<CommandFlavourFlagBits> in_stack_fffffffffffffd4e;
  Flags<CommandFlavourFlagBits> FVar6;
  allocator_type in_stack_fffffffffffffd4f;
  Flags<CommandFlavourFlagBits> in_stack_fffffffffffffd50;
  undefined2 local_2ae;
  undefined4 local_2ac;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
  flavourFlags;
  undefined8 in_stack_fffffffffffffd70;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_280;
  size_t local_268;
  size_t local_260;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_210;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_198;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_180;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_150;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_120;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_f0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_c0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_90;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_60;
  
  local_2ac = (undefined4)CONCAT71(in_register_00000089,definition);
  params = &commandData->params;
  local_268 = initialSkipCount;
  determineVectorParams(&vectorParams,this,params);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&(commandData->params).
                      super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                      ._M_impl.super__Vector_impl_data._M_start[returnParam].type.type,"void");
  if (iVar4 == 0) {
    if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      if ((vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) &&
         (*(size_t *)(vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) ==
          returnParam)) {
        stripPluralS((string *)&flavourFlags,this,name);
        pFVar2 = flavourFlags.
                 super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __n = (pointer)name->_M_string_length;
        if (__n == flavourFlags.
                   super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
          if (__n == (pointer)0x0) {
            bVar3 = true;
          }
          else {
            iVar4 = bcmp((name->_M_dataplus)._M_p,
                         flavourFlags.
                         super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,(size_t)__n);
            bVar3 = iVar4 == 0;
          }
        }
        else {
          bVar3 = false;
        }
        if (pFVar2 != (pointer)&flavourFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(pFVar2,(ulong)(flavourFlags.
                                         super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        if (bVar3) {
          flavourFlags.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          flavourFlags.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          flavourFlags.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(name,"vkGetDescriptorEXT");
          if (iVar4 == 0) {
            local_280.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_280.
                                   super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,0x60);
            std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
            ::emplace_back<Flags<CommandFlavourFlagBits>>
                      ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                        *)&flavourFlags,(Flags<CommandFlavourFlagBits> *)&local_280);
          }
          local_280.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT71(local_280.
                                 super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,4);
          std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>::
          emplace_back<Flags<CommandFlavourFlagBits>>
                    ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                      *)&flavourFlags,(Flags<CommandFlavourFlagBits> *)&local_280);
          local_280.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)returnParam;
          __l_17._M_len = 1;
          __l_17._M_array = (iterator)&local_280;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_1b0,__l_17,(allocator_type *)&local_260);
          uVar5 = 0x16c614;
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::_Rb_tree(&local_60,&vectorParams._M_t);
          returnParams_05.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&local_60;
          returnParams_05.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_1b0;
          returnParams_05.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&flavourFlags;
          vectorParams_06._M_t._M_impl._0_24_ =
               ZEXT924(CONCAT18(raii,(vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                                      *)&flavourFlags));
          vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
          vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
               in_stack_fffffffffffffd48;
          vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
               in_stack_fffffffffffffd4e.m_mask;
          vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
               in_stack_fffffffffffffd4f;
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,name,commandData,local_268,local_2ac._0_1_,
                     returnParams_05,vectorParams_06,(bool)in_stack_fffffffffffffd50.m_mask,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)flavourFlags.
                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                     flavourFlags.
                     super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish._0_1_,
                     flavourFlags.
                     super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)in_stack_fffffffffffffd70);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~_Rb_tree(&local_60);
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)flavourFlags.
                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)flavourFlags.
                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (local_1b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1b0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1b0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)flavourFlags.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)flavourFlags.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          goto joined_r0x0016c682;
        }
      }
LAB_0016c68e:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_0016c6a7;
    }
    local_260 = returnParam;
    __l_08._M_len = 1;
    __l_08._M_array = &local_260;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_198,__l_08,(allocator_type *)&local_2ae);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::_Rb_tree(&local_90,&vectorParams._M_t);
    __l_09._M_len = 1;
    __l_09._M_array = (iterator)&stack0xfffffffffffffd50;
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    vector(&flavourFlags,__l_09,(allocator_type *)&stack0xfffffffffffffd4f);
    FVar6.m_mask = '\x01';
    uVar5 = 0x16c1bd;
    __l_10._M_len = 1;
    __l_10._M_array = (iterator)&stack0xfffffffffffffd4e;
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    vector(&local_280,__l_10,(allocator_type *)&stack0xfffffffffffffd4d);
    returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_90;
    returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_198;
    returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_280;
    vectorParams_03._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
    vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
    vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
         in_stack_fffffffffffffd48;
    vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = FVar6.m_mask;
    vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
         in_stack_fffffffffffffd4f;
    generateCommandSetInclusive
              (__return_storage_ptr__,this,name,commandData,local_268,local_2ac._0_1_,
               returnParams_02,vectorParams_03,true,
               (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                *)flavourFlags.
                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
               flavourFlags.
               super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
               ._M_impl.super__Vector_impl_data._M_finish._0_1_,
               flavourFlags.
               super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
               (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                *)in_stack_fffffffffffffd70);
    if (local_280.
        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_280.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_280.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_280.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (flavourFlags.
        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(flavourFlags.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)flavourFlags.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)flavourFlags.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~_Rb_tree(&local_90);
  }
  else {
    bVar3 = isHandleType(this,&(params->
                               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               )._M_impl.super__Vector_impl_data._M_start[returnParam].type.type);
    if (bVar3) {
      if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) goto LAB_0016c68e;
      local_260 = returnParam;
      __l._M_len = 1;
      __l._M_array = &local_260;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_1c8,__l,(allocator_type *)&local_2ae);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::_Rb_tree(&local_c0,&vectorParams._M_t);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&stack0xfffffffffffffd50;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&flavourFlags,__l_00,(allocator_type *)&stack0xfffffffffffffd4f);
      FVar6.m_mask = '\x01';
      uVar5 = 0x16bddb;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&stack0xfffffffffffffd4e;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&local_280,__l_01,(allocator_type *)&stack0xfffffffffffffd4d);
      returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_c0;
      returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_1c8;
      returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = raii;
      vectorParams_00._M_t._M_impl._0_8_ = &flavourFlags;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = 0;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x1;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_280;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
           in_stack_fffffffffffffd48;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = FVar6.m_mask;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
           in_stack_fffffffffffffd4f;
      generateCommandSetInclusive
                (__return_storage_ptr__,this,name,commandData,local_268,local_2ac._0_1_,returnParams
                 ,vectorParams_00,true,
                 (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)flavourFlags.
                    super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                 flavourFlags.
                 super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish._0_1_,
                 flavourFlags.
                 super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
                 (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)in_stack_fffffffffffffd70);
      if (local_280.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.
                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_280.
                              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_280.
                              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (flavourFlags.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(flavourFlags.
                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)flavourFlags.
                              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)flavourFlags.
                              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::~_Rb_tree(&local_c0);
      local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    }
    else {
      bVar3 = isStructureChainAnchor
                        (this,&(params->
                               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               )._M_impl.super__Vector_impl_data._M_start[returnParam].type.type);
      if (bVar3) {
        if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) goto LAB_0016c68e;
        local_260 = returnParam;
        __l_02._M_len = 1;
        __l_02._M_array = &local_260;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_1e0,__l_02,(allocator_type *)&stack0xfffffffffffffd4f);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::_Rb_tree(&local_f0,&vectorParams._M_t);
        local_2ae = 0x201;
        __l_03._M_len = 2;
        __l_03._M_array = (iterator)&local_2ae;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&flavourFlags,__l_03,(allocator_type *)&stack0xfffffffffffffd4e);
        uVar5 = 0x16bf8e;
        __l_04._M_len = 2;
        __l_04._M_array = (iterator)&stack0xfffffffffffffd50;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&local_280,__l_04,(allocator_type *)&stack0xfffffffffffffd4d);
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_f0;
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_1e0;
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_280
        ;
        vectorParams_01._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
             in_stack_fffffffffffffd48;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
             in_stack_fffffffffffffd4e.m_mask;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
             in_stack_fffffffffffffd4f;
        generateCommandSetInclusive
                  (__return_storage_ptr__,this,name,commandData,local_268,local_2ac._0_1_,
                   returnParams_00,vectorParams_01,true,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)flavourFlags.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                   flavourFlags.
                   super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._0_1_,
                   flavourFlags.
                   super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)in_stack_fffffffffffffd70);
        if (local_280.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_280.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_280.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_280.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (flavourFlags.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(flavourFlags.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)flavourFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)flavourFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~_Rb_tree(&local_f0);
        local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
      else if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
        if (*(size_t *)(vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) ==
            returnParam) {
          local_260 = returnParam;
          __l_11._M_len = 1;
          __l_11._M_array = &local_260;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_210,__l_11,(allocator_type *)&stack0xfffffffffffffd50);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::_Rb_tree(&local_150,&vectorParams._M_t);
          local_2ae = 0x1001;
          __l_12._M_len = 2;
          __l_12._M_array = (iterator)&local_2ae;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&flavourFlags,__l_12,(allocator_type *)&stack0xfffffffffffffd4f);
          FVar6.m_mask = '\x01';
          uVar5 = 0x16c2e7;
          __l_13._M_len = 1;
          __l_13._M_array = (iterator)&stack0xfffffffffffffd4e;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&local_280,__l_13,(allocator_type *)&stack0xfffffffffffffd4d);
          returnParams_03.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&local_150;
          returnParams_03.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_210;
          returnParams_03.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&local_280;
          vectorParams_04._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
          vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
          vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
               in_stack_fffffffffffffd48;
          vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = FVar6.m_mask;
          vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
               in_stack_fffffffffffffd4f;
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,name,commandData,local_268,local_2ac._0_1_,
                     returnParams_03,vectorParams_04,(bool)in_stack_fffffffffffffd50.m_mask,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)flavourFlags.
                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                     flavourFlags.
                     super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish._0_1_,
                     flavourFlags.
                     super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)in_stack_fffffffffffffd70);
          if (local_280.
              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_280.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_280.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_280.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (flavourFlags.
              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(flavourFlags.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)flavourFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)flavourFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~_Rb_tree(&local_150);
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        else {
          bVar3 = isHandleType(this,&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [*(size_t *)
                                       (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_left + 1)].type.type);
          if ((((bVar3) ||
               (bVar3 = isStructureChainAnchor
                                  (this,&(params->
                                         super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                         )._M_impl.super__Vector_impl_data._M_start
                                         [*(long *)(vectorParams._M_t._M_impl.super__Rb_tree_header.
                                                    _M_header._M_left + 1)].type.type), bVar3)) ||
              (iVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 (&(params->
                                   super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                   )._M_impl.super__Vector_impl_data._M_start
                                   [*(long *)(vectorParams._M_t._M_impl.super__Rb_tree_header.
                                              _M_header._M_left + 1)].type.type,"void"), iVar4 == 0)
              ) || (pPVar1 = (params->
                             super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                   bVar3 = isLenByStructMember(this,&pPVar1[*(long *)(vectorParams._M_t._M_impl.
                                                                      super__Rb_tree_header.
                                                                      _M_header._M_left + 1)].
                                                     lenExpression,
                                               pPVar1 + (long)vectorParams._M_t._M_impl.
                                                              super__Rb_tree_header._M_header.
                                                              _M_left[1]._M_parent), !bVar3))
          goto LAB_0016c68e;
          local_260 = returnParam;
          __l_14._M_len = 1;
          __l_14._M_array = &local_260;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_228,__l_14,(allocator_type *)&local_2ae);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::_Rb_tree(&local_180,&vectorParams._M_t);
          __l_15._M_len = 1;
          __l_15._M_array = (iterator)&stack0xfffffffffffffd50;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&flavourFlags,__l_15,(allocator_type *)&stack0xfffffffffffffd4f);
          FVar6.m_mask = '\x01';
          uVar5 = 0x16c4ce;
          __l_16._M_len = 1;
          __l_16._M_array = (iterator)&stack0xfffffffffffffd4e;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&local_280,__l_16,(allocator_type *)&stack0xfffffffffffffd4d);
          returnParams_04.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&local_180;
          returnParams_04.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_228;
          returnParams_04.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&local_280;
          vectorParams_05._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
               in_stack_fffffffffffffd48;
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = FVar6.m_mask;
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
               in_stack_fffffffffffffd4f;
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,name,commandData,local_268,local_2ac._0_1_,
                     returnParams_04,vectorParams_05,true,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)flavourFlags.
                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                     flavourFlags.
                     super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish._0_1_,
                     flavourFlags.
                     super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)in_stack_fffffffffffffd70);
          if (local_280.
              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_280.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_280.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_280.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (flavourFlags.
              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(flavourFlags.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)flavourFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)flavourFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~_Rb_tree(&local_180);
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
      }
      else {
        if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) goto LAB_0016c68e;
        local_260 = returnParam;
        __l_05._M_len = 1;
        __l_05._M_array = &local_260;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_1f8,__l_05,(allocator_type *)&local_2ae);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::_Rb_tree(&local_120,&vectorParams._M_t);
        __l_06._M_len = 1;
        __l_06._M_array = (iterator)&stack0xfffffffffffffd50;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&flavourFlags,__l_06,(allocator_type *)&stack0xfffffffffffffd4f);
        FVar6.m_mask = '\x01';
        uVar5 = 0x16c0af;
        __l_07._M_len = 1;
        __l_07._M_array = (iterator)&stack0xfffffffffffffd4e;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&local_280,__l_07,(allocator_type *)&stack0xfffffffffffffd4d);
        returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_120;
        returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_1f8;
        returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_280
        ;
        vectorParams_02._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
             in_stack_fffffffffffffd48;
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = FVar6.m_mask;
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
             in_stack_fffffffffffffd4f;
        generateCommandSetInclusive
                  (__return_storage_ptr__,this,name,commandData,local_268,local_2ac._0_1_,
                   returnParams_01,vectorParams_02,true,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)flavourFlags.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                   flavourFlags.
                   super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._0_1_,
                   flavourFlags.
                   super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)in_stack_fffffffffffffd70);
        if (local_280.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_280.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_280.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_280.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (flavourFlags.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(flavourFlags.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)flavourFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)flavourFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~_Rb_tree(&local_120);
        local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
    }
  }
joined_r0x0016c682:
  if ((pointer)local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0016c6a7:
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  ::~_Rb_tree(&vectorParams._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandVoid1Return(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, size_t returnParam, bool raii ) const
{
  std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
  if ( ( commandData.params[returnParam].type.type == "void" ) )
  {
    switch ( vectorParams.size() )
    {
      case 0:
        return generateCommandSetInclusive( name,
                                            commandData,
                                            initialSkipCount,
                                            definition,
                                            { returnParam },
                                            vectorParams,
                                            false,
                                            { CommandFlavourFlagBits::enhanced },
                                            raii,
                                            false,
                                            { CommandFlavourFlagBits::enhanced } );
      case 1:
        if ( returnParam == vectorParams.begin()->first )
        {
          if ( name == stripPluralS( name ) )
          {
            std::vector<CommandFlavourFlags> flavourFlags;
            if ( name == "vkGetDescriptorEXT" )
            {
              // special handling for this function: do not return the void*, but keep its argument as it is
              flavourFlags.push_back( CommandFlavourFlagBits::noReturn | CommandFlavourFlagBits::keepVoidPtr );
            }
            flavourFlags.push_back( CommandFlavourFlagBits::singular );
            return generateCommandSetInclusive(
              name, commandData, initialSkipCount, definition, { returnParam }, vectorParams, false, flavourFlags, raii, false, flavourFlags );
          }
        }
        break;
      default: break;
    }
  }
  else if ( isHandleType( commandData.params[returnParam].type.type ) )
  {
    if ( vectorParams.empty() )
    {
      return generateCommandSetInclusive( name,
                                          commandData,
                                          initialSkipCount,
                                          definition,
                                          { returnParam },
                                          vectorParams,
                                          false,
                                          { CommandFlavourFlagBits::enhanced },
                                          raii,
                                          true,
                                          { CommandFlavourFlagBits::enhanced } );
    }
  }
  else if ( isStructureChainAnchor( commandData.params[returnParam].type.type ) )
  {
    if ( vectorParams.empty() )
    {
      return generateCommandSetInclusive( name,
                                          commandData,
                                          initialSkipCount,
                                          definition,
                                          { returnParam },
                                          vectorParams,
                                          false,
                                          { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained },
                                          raii,
                                          false,
                                          { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained } );
    }
  }
  else
  {
    switch ( vectorParams.size() )
    {
      case 0:
        return generateCommandSetInclusive( name,
                                            commandData,
                                            initialSkipCount,
                                            definition,
                                            { returnParam },
                                            vectorParams,
                                            false,
                                            { CommandFlavourFlagBits::enhanced },
                                            raii,
                                            false,
                                            { CommandFlavourFlagBits::enhanced } );
      case 1:
        if ( returnParam == vectorParams.begin()->first )
        {
          // you get a vector of stuff, with the size being one of the parameters
          return generateCommandSetInclusive( name,
                                              commandData,
                                              initialSkipCount,
                                              definition,
                                              { returnParam },
                                              vectorParams,
                                              false,
                                              { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator },
                                              raii,
                                              false,
                                              { CommandFlavourFlagBits::enhanced } );
        }
        else
        {
          if ( !isHandleType( commandData.params[vectorParams.begin()->first].type.type ) &&
               !isStructureChainAnchor( commandData.params[vectorParams.begin()->first].type.type ) &&
               ( commandData.params[vectorParams.begin()->first].type.type != "void" ) )
          {
            if ( isLenByStructMember( commandData.params[vectorParams.begin()->first].lenExpression,
                                      commandData.params[vectorParams.begin()->second.lenParam] ) )
            {
              return generateCommandSetInclusive( name,
                                                  commandData,
                                                  initialSkipCount,
                                                  definition,
                                                  { returnParam },
                                                  vectorParams,
                                                  false,
                                                  { CommandFlavourFlagBits::enhanced },
                                                  raii,
                                                  false,
                                                  { CommandFlavourFlagBits::enhanced } );
            }
          }
        }
        break;
      default: break;
    }
  }
  return "";
}